

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O1

void __thiscall
cbtIDebugDraw::drawBox(cbtIDebugDraw *this,cbtVector3 *bbMin,cbtVector3 *bbMax,cbtVector3 *color)

{
  cbtScalar local_50;
  cbtScalar local_4c;
  cbtScalar local_48;
  undefined4 local_44;
  cbtScalar local_40;
  cbtScalar local_3c;
  cbtScalar local_38;
  undefined4 local_34;
  
  local_40 = bbMin->m_floats[0];
  local_4c = bbMin->m_floats[1];
  local_48 = bbMin->m_floats[2];
  local_34 = 0;
  local_50 = bbMax->m_floats[0];
  local_44 = 0;
  local_3c = local_4c;
  local_38 = local_48;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50);
  local_50 = bbMax->m_floats[0];
  local_3c = bbMin->m_floats[1];
  local_48 = bbMin->m_floats[2];
  local_34 = 0;
  local_4c = bbMax->m_floats[1];
  local_44 = 0;
  local_40 = local_50;
  local_38 = local_48;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  local_40 = bbMax->m_floats[0];
  local_4c = bbMax->m_floats[1];
  local_48 = bbMin->m_floats[2];
  local_34 = 0;
  local_50 = bbMin->m_floats[0];
  local_44 = 0;
  local_3c = local_4c;
  local_38 = local_48;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  local_50 = bbMin->m_floats[0];
  local_3c = bbMax->m_floats[1];
  local_48 = bbMin->m_floats[2];
  local_34 = 0;
  local_4c = bbMin->m_floats[1];
  local_44 = 0;
  local_40 = local_50;
  local_38 = local_48;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  local_50 = bbMin->m_floats[0];
  local_4c = bbMin->m_floats[1];
  local_38 = bbMin->m_floats[2];
  local_34 = 0;
  local_48 = bbMax->m_floats[2];
  local_44 = 0;
  local_40 = local_50;
  local_3c = local_4c;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  local_50 = bbMax->m_floats[0];
  local_4c = bbMin->m_floats[1];
  local_38 = bbMin->m_floats[2];
  local_34 = 0;
  local_48 = bbMax->m_floats[2];
  local_44 = 0;
  local_40 = local_50;
  local_3c = local_4c;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  local_50 = bbMax->m_floats[0];
  local_4c = bbMax->m_floats[1];
  local_38 = bbMin->m_floats[2];
  local_34 = 0;
  local_48 = bbMax->m_floats[2];
  local_44 = 0;
  local_40 = local_50;
  local_3c = local_4c;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  local_50 = bbMin->m_floats[0];
  local_4c = bbMax->m_floats[1];
  local_38 = bbMin->m_floats[2];
  local_34 = 0;
  local_48 = bbMax->m_floats[2];
  local_44 = 0;
  local_40 = local_50;
  local_3c = local_4c;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  local_40 = bbMin->m_floats[0];
  local_4c = bbMin->m_floats[1];
  local_48 = bbMax->m_floats[2];
  local_34 = 0;
  local_50 = bbMax->m_floats[0];
  local_44 = 0;
  local_3c = local_4c;
  local_38 = local_48;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  local_50 = bbMax->m_floats[0];
  local_3c = bbMin->m_floats[1];
  local_48 = bbMax->m_floats[2];
  local_34 = 0;
  local_4c = bbMax->m_floats[1];
  local_44 = 0;
  local_40 = local_50;
  local_38 = local_48;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  local_40 = bbMax->m_floats[0];
  local_4c = bbMax->m_floats[1];
  local_48 = bbMax->m_floats[2];
  local_34 = 0;
  local_50 = bbMin->m_floats[0];
  local_44 = 0;
  local_3c = local_4c;
  local_38 = local_48;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  local_50 = bbMin->m_floats[0];
  local_3c = bbMax->m_floats[1];
  local_48 = bbMax->m_floats[2];
  local_34 = 0;
  local_4c = bbMin->m_floats[1];
  local_44 = 0;
  local_40 = local_50;
  local_38 = local_48;
  (*this->_vptr_cbtIDebugDraw[4])(this,&local_40,&local_50,color);
  return;
}

Assistant:

virtual void drawBox(const cbtVector3& bbMin, const cbtVector3& bbMax, const cbtVector3& color)
	{
		drawLine(cbtVector3(bbMin[0], bbMin[1], bbMin[2]), cbtVector3(bbMax[0], bbMin[1], bbMin[2]), color);
		drawLine(cbtVector3(bbMax[0], bbMin[1], bbMin[2]), cbtVector3(bbMax[0], bbMax[1], bbMin[2]), color);
		drawLine(cbtVector3(bbMax[0], bbMax[1], bbMin[2]), cbtVector3(bbMin[0], bbMax[1], bbMin[2]), color);
		drawLine(cbtVector3(bbMin[0], bbMax[1], bbMin[2]), cbtVector3(bbMin[0], bbMin[1], bbMin[2]), color);
		drawLine(cbtVector3(bbMin[0], bbMin[1], bbMin[2]), cbtVector3(bbMin[0], bbMin[1], bbMax[2]), color);
		drawLine(cbtVector3(bbMax[0], bbMin[1], bbMin[2]), cbtVector3(bbMax[0], bbMin[1], bbMax[2]), color);
		drawLine(cbtVector3(bbMax[0], bbMax[1], bbMin[2]), cbtVector3(bbMax[0], bbMax[1], bbMax[2]), color);
		drawLine(cbtVector3(bbMin[0], bbMax[1], bbMin[2]), cbtVector3(bbMin[0], bbMax[1], bbMax[2]), color);
		drawLine(cbtVector3(bbMin[0], bbMin[1], bbMax[2]), cbtVector3(bbMax[0], bbMin[1], bbMax[2]), color);
		drawLine(cbtVector3(bbMax[0], bbMin[1], bbMax[2]), cbtVector3(bbMax[0], bbMax[1], bbMax[2]), color);
		drawLine(cbtVector3(bbMax[0], bbMax[1], bbMax[2]), cbtVector3(bbMin[0], bbMax[1], bbMax[2]), color);
		drawLine(cbtVector3(bbMin[0], bbMax[1], bbMax[2]), cbtVector3(bbMin[0], bbMin[1], bbMax[2]), color);
	}